

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O0

bool __thiscall OpenCLEnum::queryDeviceInfo(OpenCLEnum *this,Device *device)

{
  cl_device_id p_Var1;
  string *psVar2;
  cl_device_id p_Var3;
  size_type sVar4;
  allocator local_239;
  key_type local_238;
  allocator local_211;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  allocator local_1c1;
  key_type local_1c0;
  undefined1 local_1a0 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensions;
  string local_168;
  allocator local_141;
  string local_140;
  allocator local_119;
  string local_118;
  allocator local_f1;
  string local_f0;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  cl_device_id local_20;
  cl_device_id device_id;
  Device *device_local;
  OpenCLEnum *this_local;
  
  p_Var1 = device->id;
  local_20 = p_Var1;
  device_id = (cl_device_id)device;
  device_local = (Device *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"CL_DEVICE_TYPE",&local_41);
  queryDeviceInfo<unsigned_long>(this,p_Var1,0x1000,&device->device_type,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  p_Var1 = local_20;
  psVar2 = (string *)(device_id + 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"CL_DEVICE_NAME",&local_79);
  queryDeviceInfo(this,p_Var1,0x102b,psVar2,&local_78,0x400);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  p_Var1 = local_20;
  psVar2 = (string *)(device_id + 0x40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"CL_DEVICE_VENDOR",&local_a1);
  queryDeviceInfo(this,p_Var1,0x102c,psVar2,&local_a0,0x400);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  p_Var1 = local_20;
  p_Var3 = device_id + 8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"CL_DEVICE_VENDOR_ID",&local_c9);
  queryDeviceInfo<unsigned_int>(this,p_Var1,0x1001,(uint *)p_Var3,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  p_Var1 = local_20;
  psVar2 = (string *)(device_id + 0x60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"CL_DEVICE_VERSION",&local_f1);
  queryDeviceInfo(this,p_Var1,0x102f,psVar2,&local_f0,0x400);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  p_Var1 = local_20;
  p_Var3 = device_id + 0x80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"CL_DEVICE_MAX_COMPUTE_UNITS",&local_119);
  queryDeviceInfo<unsigned_int>(this,p_Var1,0x1002,(uint *)p_Var3,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  p_Var1 = local_20;
  p_Var3 = device_id + 0x88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"CL_DEVICE_GLOBAL_MEM_SIZE",&local_141);
  queryDeviceInfo<unsigned_long_long>(this,p_Var1,0x101f,(unsigned_long_long *)p_Var3,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  p_Var1 = local_20;
  p_Var3 = device_id + 0x90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_168,"CL_DEVICE_MAX_CLOCK_FREQUENCY",
             (allocator *)((long)&extensions._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  queryDeviceInfo<unsigned_int>(this,p_Var1,0x100c,(uint *)p_Var3,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&extensions._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_1a0);
  queryExtensionList(this,local_20,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c0,"cl_nv_device_attribute_query",&local_1c1);
  sVar4 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1a0,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  p_Var1 = local_20;
  if (sVar4 != 0) {
    p_Var3 = device_id + 0x94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1e8,"CL_DEVICE_PCI_BUS_ID_NV",&local_1e9);
    queryDeviceInfo<unsigned_int>(this,p_Var1,0x4008,(uint *)p_Var3,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    p_Var1 = local_20;
    p_Var3 = device_id + 0x98;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_210,"CL_DEVICE_PCI_SLOT_ID_NV",&local_211);
    queryDeviceInfo<unsigned_int>(this,p_Var1,0x4009,(uint *)p_Var3,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_238,"cl_khr_spir",&local_239);
  sVar4 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1a0,&local_238);
  device_id[0x9c] = (_cl_device_id)(sVar4 != 0);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1a0);
  return true;
}

Assistant:

bool OpenCLEnum::queryDeviceInfo(Device &device)
{
	cl_device_id device_id = device.id;

	queryDeviceInfo(device_id, CL_DEVICE_TYPE,					device.device_type,		"CL_DEVICE_TYPE");
	queryDeviceInfo(device_id, CL_DEVICE_NAME,					device.name,			"CL_DEVICE_NAME", 1024);
	queryDeviceInfo(device_id, CL_DEVICE_VENDOR,				device.vendor,			"CL_DEVICE_VENDOR", 1024);
	queryDeviceInfo(device_id, CL_DEVICE_VENDOR_ID,				device.vendor_id,		"CL_DEVICE_VENDOR_ID");
	queryDeviceInfo(device_id, CL_DEVICE_VERSION,				device.version,			"CL_DEVICE_VERSION", 1024);
	queryDeviceInfo(device_id, CL_DEVICE_MAX_COMPUTE_UNITS,		device.compute_units,	"CL_DEVICE_MAX_COMPUTE_UNITS");
	queryDeviceInfo(device_id, CL_DEVICE_GLOBAL_MEM_SIZE,		device.mem_size,		"CL_DEVICE_GLOBAL_MEM_SIZE");
	queryDeviceInfo(device_id, CL_DEVICE_MAX_CLOCK_FREQUENCY,	device.clock,			"CL_DEVICE_MAX_CLOCK_FREQUENCY");

	std::set< std::string > extensions;
	queryExtensionList(device_id, extensions);

	if (extensions.count("cl_nv_device_attribute_query")) {
		queryDeviceInfo(device_id, CL_DEVICE_PCI_BUS_ID_NV,		device.nvidia_pci_bus_id,	"CL_DEVICE_PCI_BUS_ID_NV");
		queryDeviceInfo(device_id, CL_DEVICE_PCI_SLOT_ID_NV,	device.nvidia_pci_slot_id,	"CL_DEVICE_PCI_SLOT_ID_NV");
	}

	device.has_cl_khr_spir = (extensions.count("cl_khr_spir") != 0);

	return true;
}